

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routing_table.cpp
# Opt level: O0

tuple<int,_int,_int> __thiscall libtorrent::dht::routing_table::size(routing_table *this)

{
  bool bVar1;
  reference this_00;
  size_type sVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  long in_RSI;
  tuple<int,_int,_int> tVar5;
  routing_table_node *i;
  const_iterator __end2;
  const_iterator __begin2;
  table_t *__range2;
  int local_20;
  int confirmed;
  int replacements;
  int nodes;
  routing_table *this_local;
  
  confirmed = 0;
  local_20 = 0;
  this_local = this;
  __end2 = ::std::
           vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>
           ::begin((vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>
                    *)(in_RSI + 0x10));
  i = (routing_table_node *)
      ::std::
      vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>
      ::end((vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>
             *)(in_RSI + 0x10));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_libtorrent::dht::routing_table_node_*,_std::vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>_>
                                *)&i);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_libtorrent::dht::routing_table_node_*,_std::vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>_>
              ::operator*(&__end2);
    sVar2 = ::std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
            ::size(&(this_00->live_nodes).
                    super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                  );
    confirmed = (int)sVar2 + confirmed;
    cVar3 = ::std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
            ::begin(&(this_00->live_nodes).
                     super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                   );
    cVar4 = ::std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
            ::end(&(this_00->live_nodes).
                   super_vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                 );
    ::std::
    count_if<__gnu_cxx::__normal_iterator<libtorrent::dht::node_entry_const*,std::vector<libtorrent::dht::node_entry,std::allocator<libtorrent::dht::node_entry>>>,libtorrent::dht::routing_table::size()const::__0>
              (cVar3._M_current,cVar4._M_current);
    sVar2 = ::std::vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
            ::size((vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                    *)this_00);
    local_20 = (int)sVar2 + local_20;
    __gnu_cxx::
    __normal_iterator<const_libtorrent::dht::routing_table_node_*,_std::vector<libtorrent::dht::routing_table_node,_std::allocator<libtorrent::dht::routing_table_node>_>_>
    ::operator++(&__end2);
  }
  tVar5 = ::std::make_tuple<int&,int&,int&>((int *)this,&confirmed,&local_20);
  tVar5.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
       (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<int,_int,_int>)tVar5.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

std::tuple<int, int, int> routing_table::size() const
{
	int nodes = 0;
	int replacements = 0;
	int confirmed = 0;
	for (auto const& i : m_buckets)
	{
		nodes += int(i.live_nodes.size());
		confirmed += static_cast<int>(std::count_if(i.live_nodes.begin(), i.live_nodes.end()
			, [](node_entry const& k) { return k.confirmed(); } ));

		replacements += int(i.replacements.size());
	}
	return std::make_tuple(nodes, replacements, confirmed);
}